

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

void sb_return_reusable_blocks(fdb_kvs_handle *handle)

{
  avl_tree *paVar1;
  superblock *psVar2;
  ulong uVar3;
  sb_rsv_bmp *rsv;
  avl_node *paVar4;
  ulong pos;
  uint64_t pos_00;
  avl_node *paVar5;
  bool bVar6;
  bmp_idx_node query;
  avl_node local_48;
  
  psVar2 = handle->file->sb;
  if (psVar2 != (superblock *)0x0) {
    uVar3 = (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i;
    pos = (psVar2->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
    if (pos < uVar3) {
      paVar1 = &psVar2->bmp_idx;
      do {
        if (((psVar2->bmp)._M_b._M_p[pos >> 3] & bmp_basic_mask[(uint)pos & 7]) != 0) {
          filemgr_add_stale_block(handle->file,pos,1);
        }
        if (pos != 0 && (char)pos == '\0') {
          paVar5 = (avl_node *)(pos >> 8);
          paVar4 = avl_search(paVar1,&local_48,_bmp_idx_cmp);
          if (paVar4 != (avl_node *)0x0) {
            avl_remove(paVar1,paVar4);
            free(&paVar4[-1].right);
          }
          paVar4 = avl_first(paVar1);
          while (pos = uVar3, paVar4 != (avl_node *)0x0) {
            if (paVar5 < paVar4[-1].right) {
              pos = (long)paVar4[-1].right << 8;
              break;
            }
            avl_remove(paVar1,paVar4);
            free(&paVar4[-1].right);
            paVar4 = avl_first(paVar1);
          }
        }
        pos = pos + 1;
      } while (pos < uVar3);
    }
    psVar2->num_free_blocks = 0;
    LOCK();
    (psVar2->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
    UNLOCK();
    rsv = psVar2->rsv_bmp;
    if (rsv != (sb_rsv_bmp *)0x0) {
      LOCK();
      bVar6 = (rsv->status).super___atomic_base<unsigned_int>._M_i == 0xffff;
      if (bVar6) {
        (rsv->status).super___atomic_base<unsigned_int>._M_i = 0;
      }
      UNLOCK();
      if (bVar6) {
        pos_00 = rsv->cur_alloc_bid;
        if (pos_00 < rsv->bmp_size) {
          paVar1 = &rsv->bmp_idx;
          do {
            if ((rsv->bmp[pos_00 >> 3] & bmp_basic_mask[(uint)pos_00 & 7]) != 0) {
              filemgr_add_stale_block(handle->file,pos_00,1);
            }
            if (pos_00 != 0 && (char)pos_00 == '\0') {
              paVar4 = avl_search(paVar1,&local_48,_bmp_idx_cmp);
              if (paVar4 == (avl_node *)0x0) goto LAB_00135360;
              do {
                avl_remove(paVar1,paVar4);
                free(&paVar4[-1].right);
LAB_00135360:
                paVar4 = avl_first(paVar1);
                if (paVar4 == (avl_node *)0x0) {
                  pos_00 = rsv->bmp_size;
                  goto LAB_0013539c;
                }
              } while (paVar4[-1].right <= (avl_node *)(pos_00 >> 8));
              pos_00 = (long)paVar4[-1].right << 8;
            }
LAB_0013539c:
            pos_00 = pos_00 + 1;
          } while (pos_00 < rsv->bmp_size);
        }
        rsv->num_free_blocks = 0;
        rsv->cur_alloc_bid = 0xffffffffffffffff;
        _free_bmp_idx(&rsv->bmp_idx);
        _rsv_free(rsv);
        free(rsv);
        psVar2->rsv_bmp = (sb_rsv_bmp *)0x0;
      }
    }
    fdb_gather_stale_blocks
              (handle,(handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i + 1,
               0xffffffffffffffff,0xffffffffffffffff,0,(list_elem *)0x0,false);
  }
  return;
}

Assistant:

void sb_return_reusable_blocks(fdb_kvs_handle *handle)
{
    uint64_t node_id;
    bid_t cur;
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv;
    struct avl_node *a;
    struct bmp_idx_node *item, query;

    if (!sb) {
        // we don't need to do this.
        return;
    }

    // re-insert all remaining bitmap into stale list
    uint64_t sb_bmp_size = atomic_get_uint64_t(&sb->bmp_size);
    for (cur = atomic_get_uint64_t(&sb->cur_alloc_bid); cur < sb_bmp_size; ++cur) {
        if (_is_bmp_set(sb->bmp, cur)) {
            filemgr_add_stale_block(handle->file, cur, 1);
        }

        if ((cur % 256) == 0 && cur > 0) {
            // node ID changes
            // remove & free current bmp node
            node_id = cur / 256;
            query.id = node_id - 1;
            a = avl_search(&sb->bmp_idx, &query.avl, _bmp_idx_cmp);
            if (a) {
                item = _get_entry(a, struct bmp_idx_node, avl);
                avl_remove(&sb->bmp_idx, a);
                free(item);
            }

            // move to next bmp node
            do {
                a = avl_first(&sb->bmp_idx);
                if (a) {
                    item = _get_entry(a, struct bmp_idx_node, avl);
                    if (item->id <= node_id) {
                        avl_remove(&sb->bmp_idx, a);
                        free(item);
                        continue;
                    }
                    cur = item->id * 256;
                    break;
                }

                // no more reusable block
                cur = sb_bmp_size;
                break;
            } while (true);
        }
    }
    sb->num_free_blocks = 0;
    atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);

    // do the same work for the reserved blocks if exist
    rsv = sb->rsv_bmp;
    if (rsv &&
        atomic_cas_uint32_t(&rsv->status, SB_RSV_READY, SB_RSV_VOID)) {

        for (cur = rsv->cur_alloc_bid; cur < rsv->bmp_size; ++cur) {
            if (_is_bmp_set(rsv->bmp, cur)) {
                filemgr_add_stale_block(handle->file, cur, 1);
            }

            if ((cur % 256) == 0 && cur > 0) {
                // node ID changes
                // remove & free current bmp node
                node_id = cur / 256;
                query.id = node_id - 1;
                a = avl_search(&rsv->bmp_idx, &query.avl, _bmp_idx_cmp);
                if (a) {
                    item = _get_entry(a, struct bmp_idx_node, avl);
                    avl_remove(&rsv->bmp_idx, a);
                    free(item);
                }

                // move to next bmp node
                do {
                    a = avl_first(&rsv->bmp_idx);
                    if (a) {
                        item = _get_entry(a, struct bmp_idx_node, avl);
                        if (item->id <= node_id) {
                            avl_remove(&rsv->bmp_idx, a);
                            free(item);
                            continue;
                        }
                        cur = item->id * 256;
                        break;
                    }

                    // no more reusable block
                    cur = rsv->bmp_size;
                    break;
                } while (true);
            }
        }
        rsv->num_free_blocks = 0;
        rsv->cur_alloc_bid = BLK_NOT_FOUND;

        _free_bmp_idx(&rsv->bmp_idx);
        _rsv_free(rsv);
        free(rsv);
        sb->rsv_bmp = NULL;
    }

    // re-store into stale tree using next header's revnum
    filemgr_header_revnum_t revnum = handle->cur_header_revnum;
    fdb_gather_stale_blocks(handle, revnum+1, BLK_NOT_FOUND, BLK_NOT_FOUND, 0, NULL, false);
}